

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamWriter.h
# Opt level: O2

void __thiscall
Assimp::StreamWriter<false,_false>::StreamWriter
          (StreamWriter<false,_false> *this,shared_ptr<Assimp::IOStream> *stream,bool le)

{
  std::__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2> *)this,
             &stream->super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>);
  this->le = le;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->cursor = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(&this->buffer,0x400);
  return;
}

Assistant:

StreamWriter(std::shared_ptr<IOStream> stream, bool le = false)
        : stream(stream)
        , le(le)
        , cursor()
    {
        ai_assert(stream);
        buffer.reserve(INITIAL_CAPACITY);
    }